

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# linkValidate.cpp
# Opt level: O1

TString * glslang::getNameForIdMap_abi_cxx11_(TIntermSymbol *symbol)

{
  int iVar1;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  TString *pTVar2;
  
  iVar1 = (*(symbol->super_TIntermTyped).super_TIntermNode._vptr_TIntermNode[0x1e])();
  if ((*(char *)(CONCAT44(extraout_var,iVar1) + 8) == '\x10') &&
     (0xfffffffb < (*(uint *)(CONCAT44(extraout_var,iVar1) + 0x18) & 0x7f) - 7)) {
    iVar1 = (*(symbol->super_TIntermTyped).super_TIntermNode._vptr_TIntermNode[0x1e])(symbol);
    pTVar2 = (TString *)
             (**(code **)(*(long *)CONCAT44(extraout_var_01,iVar1) + 0x28))
                       ((long *)CONCAT44(extraout_var_01,iVar1));
    return pTVar2;
  }
  iVar1 = (*(symbol->super_TIntermTyped).super_TIntermNode._vptr_TIntermNode[0x32])(symbol);
  return (TString *)CONCAT44(extraout_var_00,iVar1);
}

Assistant:

static const TString& getNameForIdMap(TIntermSymbol* symbol)
{
    TShaderInterface si = symbol->getType().getShaderInterface();
    if (si == EsiNone)
        return symbol->getName();
    else
        return symbol->getType().getTypeName();
}